

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall
t_go_generator::generate_go_equals_struct
          (t_go_generator *this,ostream *out,t_type *ttype,string *tgt,string *src)

{
  ostream *poVar1;
  string sStack_48;
  
  t_generator::indent_abi_cxx11_(&sStack_48,&this->super_t_generator);
  poVar1 = std::operator<<(out,(string *)&sStack_48);
  poVar1 = std::operator<<(poVar1,"if !");
  poVar1 = std::operator<<(poVar1,(string *)tgt);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = std::operator<<(poVar1,(string *)&this->equals_method_name_);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::operator<<(poVar1,(string *)src);
  poVar1 = std::operator<<(poVar1,") { return false }");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

void t_go_generator::generate_go_equals_struct(ostream& out,
                                               t_type* ttype,
                                               string tgt,
                                               string src) {
  (void)ttype;
  out << indent() << "if !" << tgt << "." << equals_method_name_ << "(" << src
      << ") { return false }" << endl;
}